

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void InitializeLogger(string *info_log_filename,string *warn_log_filename,string *erro_log_filename)

{
  char cVar1;
  char cVar2;
  ostream *poVar3;
  
  std::ofstream::open(Logger::info_log_file_,(_Ios_Openmode)(info_log_filename->_M_dataplus)._M_p);
  std::ofstream::open(Logger::warn_log_file_,(_Ios_Openmode)(warn_log_filename->_M_dataplus)._M_p);
  std::ofstream::open(Logger::erro_log_file_,(_Ios_Openmode)(erro_log_filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot create file: ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(info_log_filename->_M_dataplus)._M_p,
                        info_log_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Please check that whether you need to ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"create a new directory. \n",0x19);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot create file: ",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(warn_log_filename->_M_dataplus)._M_p,
                        warn_log_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Please check that whether you need to ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"create a new directory. \n",0x19);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') goto LAB_0011b3cc;
  }
  else {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      if (cVar1 != '\0') {
        return;
      }
      goto LAB_0011b3cc;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cannot create file:  ",0x15);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(erro_log_filename->_M_dataplus)._M_p,
                      erro_log_filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Please check that whether you need to ",0x26);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"create a new directory. \n",0x19);
LAB_0011b3cc:
  exit(0);
}

Assistant:

void InitializeLogger(const std::string& info_log_filename,
                      const std::string& warn_log_filename,
                      const std::string& erro_log_filename) {
  Logger::info_log_file_.open(info_log_filename.c_str());
  Logger::warn_log_file_.open(warn_log_filename.c_str());
  Logger::erro_log_file_.open(erro_log_filename.c_str());
  // check if the file has been open
  bool bo = false;
  if (Logger::info_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << info_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::warn_log_file_.is_open() == 0) {
    std::cout << "Cannot create file: " << warn_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (Logger::erro_log_file_.is_open() == 0) {
    std::cout << "Cannot create file:  " << erro_log_filename << ". "
              << "Please check that whether you need to "
              << "create a new directory. \n";
    bo = true;
  }
  if (bo) { exit(0); }
}